

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::moveFromSpan
          (Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *this,
          Span<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *fromSpan,size_t fromIndex,
          size_t to)

{
  Entry *pEVar1;
  uchar *puVar2;
  byte bVar3;
  byte bVar4;
  Entry *pEVar5;
  Entry *pEVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uchar uVar9;
  
  uVar9 = this->nextFree;
  if (uVar9 == this->allocated) {
    addStorage(this);
    uVar9 = this->nextFree;
  }
  this->offsets[to] = uVar9;
  pEVar5 = this->entries;
  bVar3 = this->nextFree;
  this->nextFree = pEVar5[bVar3].storage.data[0];
  bVar4 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar6 = fromSpan->entries;
  uVar7 = *(undefined8 *)pEVar6[bVar4].storage.data;
  uVar8 = *(undefined8 *)(pEVar6[bVar4].storage.data + 8);
  pEVar1 = pEVar6 + bVar4;
  (pEVar1->storage).data[0] = '\0';
  (pEVar1->storage).data[1] = '\0';
  (pEVar1->storage).data[2] = '\0';
  (pEVar1->storage).data[3] = '\0';
  (pEVar1->storage).data[4] = '\0';
  (pEVar1->storage).data[5] = '\0';
  (pEVar1->storage).data[6] = '\0';
  (pEVar1->storage).data[7] = '\0';
  *(undefined8 *)pEVar5[bVar3].storage.data = uVar7;
  *(undefined8 *)(pEVar5[bVar3].storage.data + 8) = uVar8;
  *(undefined8 *)(pEVar5[bVar3].storage.data + 0x10) =
       *(undefined8 *)(pEVar6[bVar4].storage.data + 0x10);
  puVar2 = pEVar6[bVar4].storage.data + 8;
  puVar2[0] = '\0';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
  puVar2[4] = '\0';
  puVar2[5] = '\0';
  puVar2[6] = '\0';
  puVar2[7] = '\0';
  puVar2[8] = '\0';
  puVar2[9] = '\0';
  puVar2[10] = '\0';
  puVar2[0xb] = '\0';
  puVar2[0xc] = '\0';
  puVar2[0xd] = '\0';
  puVar2[0xe] = '\0';
  puVar2[0xf] = '\0';
  pEVar5[bVar3].storage.data[0x18] = pEVar6[bVar4].storage.data[0x18];
  QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)(pEVar6 + bVar4));
  pEVar6[bVar4].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar4;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }